

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscalls.cpp
# Opt level: O1

external_function *
skiwi::convert_external_to_vm(external_function *__return_storage_ptr__,external_function *ext)

{
  pointer paVar1;
  iterator __position;
  undefined8 in_RAX;
  argtype aVar2;
  pointer paVar3;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->arguments).
  super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->arguments).
  super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->arguments).
  super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_38 = in_RAX;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->address = ext->address;
  aVar2 = T_VOID;
  if ((ulong)ext->return_type < 6) {
    aVar2 = *(argtype *)(&DAT_00261a18 + (ulong)ext->return_type * 4);
  }
  __return_storage_ptr__->return_type = aVar2;
  paVar3 = (ext->arguments).
           super__Vector_base<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = (ext->arguments).
           super__Vector_base<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (paVar3 != paVar1) {
    do {
      aVar2 = T_VOID;
      if ((ulong)*paVar3 < 6) {
        aVar2 = *(argtype *)(&DAT_00261a18 + (ulong)*paVar3 * 4);
      }
      uStack_38 = CONCAT44(aVar2,(undefined4)uStack_38);
      __position._M_current =
           (__return_storage_ptr__->arguments).
           super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->arguments).
          super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
        ::_M_realloc_insert<assembler::external_function::argtype>
                  (&__return_storage_ptr__->arguments,__position,(argtype *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = aVar2;
        (__return_storage_ptr__->arguments).
        super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      paVar3 = paVar3 + 1;
    } while (paVar3 != paVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

ASM::external_function convert_external_to_vm(const external_function& ext)
{
    ASM::external_function ef;
    ef.name = ext.name;
    ef.address = ext.address;
    ef.return_type = convert(ext.return_type);
    for (auto arg : ext.arguments)
      {
      ef.arguments.push_back(convert(arg));
      }
    return ef;
}